

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderCheckMark(ImDrawList *draw_list,ImVec2 pos,ImU32 col,float sz)

{
  ImVec2 *pIVar1;
  float fVar2;
  undefined1 auVar3 [16];
  ImVec2 *pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar11._4_60_ = in_register_00001244;
  auVar11._0_4_ = sz;
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = pos;
  auVar12._0_4_ = sz / 5.0;
  auVar12._4_12_ = in_register_00001244._0_12_;
  iVar6 = (draw_list->_Path).Size;
  auVar12 = vmaxss_avx(auVar12,ZEXT416(0x3f800000));
  auVar3 = vfnmadd231ss_fma(auVar11._0_16_,auVar12,SUB6416(ZEXT464(0x3f000000),0));
  fVar2 = auVar12._0_4_ * 0.25;
  auVar8 = vmovshdup_avx(auVar10._0_16_);
  auVar13._0_4_ = auVar3._0_4_ / 3.0;
  auVar13._4_12_ = auVar3._4_12_;
  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ + auVar8._0_4_ + fVar2)),auVar13,
                            SUB6416(ZEXT464(0x3f000000),0));
  fVar2 = pos.x + fVar2 + auVar13._0_4_;
  fVar9 = auVar8._0_4_;
  if (iVar6 == (draw_list->_Path).Capacity) {
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    iVar7 = iVar6 + 1;
    if (iVar6 + 1 < iVar5) {
      iVar7 = iVar5;
    }
    pIVar4 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
    pIVar1 = (draw_list->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar1,(long)(draw_list->_Path).Size << 3);
      MemFree((draw_list->_Path).Data);
    }
    (draw_list->_Path).Data = pIVar4;
    (draw_list->_Path).Capacity = iVar7;
    iVar6 = (draw_list->_Path).Size;
  }
  else {
    pIVar4 = (draw_list->_Path).Data;
  }
  auVar8._8_4_ = 0x80000000;
  auVar8._0_8_ = 0x8000000080000000;
  auVar8._12_4_ = 0x80000000;
  auVar8 = vxorps_avx512vl(auVar13,auVar8);
  pIVar4[iVar6].x = fVar2 - auVar13._0_4_;
  pIVar4[iVar6].y = fVar9 - auVar13._0_4_;
  iVar5 = (draw_list->_Path).Size;
  iVar6 = iVar5 + 1;
  (draw_list->_Path).Size = iVar6;
  if (iVar6 == (draw_list->_Path).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar5 < iVar6) {
      iVar5 = iVar6;
    }
    pIVar4 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
    pIVar1 = (draw_list->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar1,(long)(draw_list->_Path).Size << 3);
      MemFree((draw_list->_Path).Data);
    }
    (draw_list->_Path).Data = pIVar4;
    (draw_list->_Path).Capacity = iVar5;
    iVar6 = (draw_list->_Path).Size;
  }
  else {
    pIVar4 = (draw_list->_Path).Data;
  }
  pIVar4[iVar6].x = fVar2;
  pIVar4[iVar6].y = fVar9;
  iVar5 = (draw_list->_Path).Size;
  iVar6 = iVar5 + 1;
  (draw_list->_Path).Size = iVar6;
  if (iVar6 == (draw_list->_Path).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar5 < iVar6) {
      iVar5 = iVar6;
    }
    pIVar4 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
    pIVar1 = (draw_list->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar1,(long)(draw_list->_Path).Size << 3);
      MemFree((draw_list->_Path).Data);
    }
    (draw_list->_Path).Data = pIVar4;
    (draw_list->_Path).Capacity = iVar5;
    iVar6 = (draw_list->_Path).Size;
  }
  else {
    pIVar4 = (draw_list->_Path).Data;
  }
  auVar3 = vfmadd213ss_fma(auVar13,SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar2));
  auVar8 = vfmadd213ss_fma(auVar8,SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar9));
  pIVar4[iVar6].x = auVar3._0_4_;
  pIVar4[iVar6].y = auVar8._0_4_;
  iVar6 = (draw_list->_Path).Size + 1;
  (draw_list->_Path).Size = iVar6;
  ImDrawList::AddPolyline(draw_list,(draw_list->_Path).Data,iVar6,col,false,auVar12._0_4_);
  (draw_list->_Path).Size = 0;
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImDrawList* draw_list, ImVec2 pos, ImU32 col, float sz)
{
    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness * 0.5f;
    pos += ImVec2(thickness * 0.25f, thickness * 0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third * 0.5f;
    draw_list->PathLineTo(ImVec2(bx - third, by - third));
    draw_list->PathLineTo(ImVec2(bx, by));
    draw_list->PathLineTo(ImVec2(bx + third * 2.0f, by - third * 2.0f));
    draw_list->PathStroke(col, false, thickness);
}